

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

ON_SubD_ComponentIdTypeAndTag
ON_SubD_ComponentIdTypeAndTag::CreateFromEdgeId(uint edge_id,ON_SubDEdgeTag etag)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  undefined3 in_register_00000031;
  
  uVar2 = 1;
  if (CONCAT31(in_register_00000031,etag) != 4) {
    uVar2 = (ulong)(etag & (SmoothX|Crease|Smooth));
  }
  uVar3 = 0;
  if (edge_id != 0) {
    uVar3 = uVar2 << 0x28 | 0x400000000;
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = edge_id | uVar3;
  return (ON_SubD_ComponentIdTypeAndTag)(auVar1 << 0x40);
}

Assistant:

const ON_SubD_ComponentIdTypeAndTag ON_SubD_ComponentIdTypeAndTag::CreateFromEdgeId(unsigned edge_id, ON_SubDEdgeTag etag)
{
  ON_SubD_ComponentIdTypeAndTag itt;
  if (edge_id > 0)
  {
    itt.m_sharpness = ON_SubDEdgeSharpness::Smooth;
    itt.m_id = edge_id;
    itt.m_type = ON_SubDComponentPtr::Type::Edge;
    itt.Internal_SetTag(static_cast<unsigned char>(ON_SubDEdgeTag::SmoothX == etag ? ON_SubDEdgeTag::Smooth : etag));
  }
  return itt;
}